

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

void linklist_5_3::test_1(void)

{
  undefined4 *puVar1;
  LinkList in_RSI;
  sqlist_5_3 *this;
  
  this = (sqlist_5_3 *)&DAT_00000010;
  puVar1 = (undefined4 *)malloc(0x10);
  *puVar1 = 0;
  sqlist_5_3::test_1(this,in_RSI);
}

Assistant:

void test_1() {
        LinkList list;
        auto a = newNode;
        a->data = 0;
        a->next = list;
        ps_link_list(list);
//        insert(list, 3, 12);
//        int e;
//        del_(list, 4, &e);
//        reverse_order(list);
//        reverse(a);
//        ps_link_list(a);
//        sort_asc(a);
//        sort_desc(a);
//        del_rank_(a, 2, 8);
        select_order(a);
        ps_link_list(a);
    }